

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O0

int idaNlsResidualSensSim(N_Vector ycorSim,N_Vector resSim,void *ida_mem)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  N_Vector *resS;
  N_Vector *ycorS;
  N_Vector res;
  N_Vector ycor;
  int retval;
  IDAMem IDA_mem;
  int local_1c;
  
  if (in_RDX == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x16d,"idaNlsResidualSensSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
    local_1c = -0x14;
  }
  else {
    uVar1 = **(undefined8 **)*in_RDI;
    uVar2 = **(undefined8 **)*in_RSI;
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x290),uVar1,
                 *(undefined8 *)(in_RDX + 0x280));
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x508),*(undefined8 *)(in_RDX + 0x298),
                 uVar1,*(undefined8 *)(in_RDX + 0x288));
    iVar5 = (**(code **)(in_RDX + 0x730))
                      (*(undefined8 *)(in_RDX + 0x4f8),*(undefined8 *)(in_RDX + 0x280),
                       *(undefined8 *)(in_RDX + 0x288),uVar2,*(undefined8 *)(in_RDX + 0x18));
    *(long *)(in_RDX + 0x5c0) = *(long *)(in_RDX + 0x5c0) + 1;
    N_VScale(0x3ff0000000000000,uVar2,*(undefined8 *)(in_RDX + 0x2b8));
    if (iVar5 < 0) {
      local_1c = -8;
    }
    else if (iVar5 < 1) {
      lVar3 = *(long *)*in_RDI;
      lVar4 = *(long *)*in_RSI;
      N_VLinearSumVectorArray
                (0x3ff0000000000000,*(undefined4 *)(in_RDX + 0xa0),*(undefined8 *)(in_RDX + 0x3a0),
                 lVar3 + 8,*(undefined8 *)(in_RDX + 0x390));
      N_VLinearSumVectorArray
                (0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x508),*(undefined4 *)(in_RDX + 0xa0),
                 *(undefined8 *)(in_RDX + 0x3a8),lVar3 + 8,*(undefined8 *)(in_RDX + 0x398));
      iVar5 = (**(code **)(in_RDX + 0xa8))
                        (*(undefined8 *)(in_RDX + 0x4f8),*(undefined4 *)(in_RDX + 0xa0),
                         *(undefined8 *)(in_RDX + 0x280),*(undefined8 *)(in_RDX + 0x288),uVar2,
                         *(undefined8 *)(in_RDX + 0x390),*(undefined8 *)(in_RDX + 0x398),lVar4 + 8,
                         *(undefined8 *)(in_RDX + 0xb0),*(undefined8 *)(in_RDX + 0x3b8),
                         *(undefined8 *)(in_RDX + 0x3c0),*(undefined8 *)(in_RDX + 0x3c8));
      *(long *)(in_RDX + 0x5d0) = *(long *)(in_RDX + 0x5d0) + 1;
      if (iVar5 < 0) {
        local_1c = -0x29;
      }
      else if (iVar5 < 1) {
        local_1c = 0;
      }
      else {
        local_1c = 0xb;
      }
    }
    else {
      local_1c = 1;
    }
  }
  return local_1c;
}

Assistant:

static int idaNlsResidualSensSim(N_Vector ycorSim, N_Vector resSim, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval;
  N_Vector ycor, res;
  N_Vector *ycorS, *resS;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* extract state and residual vectors from the vector wrapper */
  ycor = NV_VEC_SW(ycorSim, 0);
  res  = NV_VEC_SW(resSim, 0);

  /* update yy and yp based on the current correction */
  N_VLinearSum(ONE, IDA_mem->ida_yypredict, ONE, ycor, IDA_mem->ida_yy);
  N_VLinearSum(ONE, IDA_mem->ida_yppredict, IDA_mem->ida_cj, ycor,
               IDA_mem->ida_yp);

  /* evaluate residual */
  retval = IDA_mem->nls_res(IDA_mem->ida_tn, IDA_mem->ida_yy, IDA_mem->ida_yp,
                            res, IDA_mem->ida_user_data);

  /* increment the number of residual evaluations */
  IDA_mem->ida_nre++;

  /* save a copy of the residual vector in savres */
  N_VScale(ONE, res, IDA_mem->ida_savres);

  if (retval < 0) { return (IDA_RES_FAIL); }
  if (retval > 0) { return (IDA_RES_RECVR); }

  /* extract sensitivity and residual vectors from the vector wrapper */
  ycorS = NV_VECS_SW(ycorSim) + 1;
  resS  = NV_VECS_SW(resSim) + 1;

  /* update yS and ypS based on the current correction */
  N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_yySpredict, ONE,
                          ycorS, IDA_mem->ida_yyS);
  N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_ypSpredict,
                          IDA_mem->ida_cj, ycorS, IDA_mem->ida_ypS);

  /* evaluate sens residual */
  retval = IDA_mem->ida_resS(IDA_mem->ida_Ns, IDA_mem->ida_tn, IDA_mem->ida_yy,
                             IDA_mem->ida_yp, res, IDA_mem->ida_yyS,
                             IDA_mem->ida_ypS, resS, IDA_mem->ida_user_dataS,
                             IDA_mem->ida_tmpS1, IDA_mem->ida_tmpS2,
                             IDA_mem->ida_tmpS3);

  /* increment the number of sens residual evaluations */
  IDA_mem->ida_nrSe++;

  if (retval < 0) { return (IDA_SRES_FAIL); }
  if (retval > 0) { return (IDA_SRES_RECVR); }

  return (IDA_SUCCESS);
}